

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

void GA_Step_max_patch(int g_a,int *alo,int *ahi,int g_b,int *blo,int *bhi,void *step)

{
  long lVar1;
  long lVar2;
  Integer _ga_bhi [7];
  Integer _ga_blo [7];
  Integer _ga_ahi [7];
  Integer _ga_alo [7];
  long lStack_130;
  Integer local_128 [7];
  long lStack_f0;
  Integer local_e8 [7];
  long lStack_b0;
  Integer local_a8 [7];
  long lStack_70;
  Integer local_68 [7];
  
  lVar1 = pnga_ndim((long)g_a);
  lVar2 = lVar1;
  if (0 < lVar1) {
    do {
      (&lStack_70)[lVar2] = (long)*alo + 1;
      alo = alo + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    lVar2 = lVar1;
    if (0 < lVar1) {
      do {
        (&lStack_b0)[lVar2] = (long)*ahi + 1;
        ahi = ahi + 1;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
      lVar2 = lVar1;
      if (0 < lVar1) {
        do {
          (&lStack_f0)[lVar2] = (long)*blo + 1;
          blo = blo + 1;
          lVar2 = lVar2 + -1;
        } while (lVar2 != 0);
        if (0 < lVar1) {
          do {
            (&lStack_130)[lVar1] = (long)*bhi + 1;
            bhi = bhi + 1;
            lVar1 = lVar1 + -1;
          } while (lVar1 != 0);
        }
      }
    }
  }
  pnga_step_max_patch((long)g_a,local_68,local_a8,(long)g_b,local_e8,local_128,step);
  return;
}

Assistant:

void GA_Step_max_patch(int g_a, int alo[], int ahi[], int g_b, int blo[], int bhi[], void *step)
{
    Integer a = (Integer)g_a;
    Integer b = (Integer)g_b;
    Integer ndim = wnga_ndim(a);
    Integer _ga_alo[MAXDIM], _ga_ahi[MAXDIM];
    Integer _ga_blo[MAXDIM], _ga_bhi[MAXDIM];
    COPYINDEX_C2F(alo,_ga_alo, ndim);
    COPYINDEX_C2F(ahi,_ga_ahi, ndim);
    COPYINDEX_C2F(blo,_ga_blo, ndim);
    COPYINDEX_C2F(bhi,_ga_bhi, ndim);
    wnga_step_max_patch(a, _ga_alo, _ga_ahi, b, _ga_blo, _ga_bhi, step);
}